

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alffplay.cpp
# Opt level: O3

ostream * anon_unknown.dwarf_e2e2::operator<<(ostream *os,PrettyTime *rhs)

{
  ostream *poVar1;
  ostream *poVar2;
  long lVar3;
  char local_2d [5];
  
  if ((long)rhs < 0) {
    local_2d[0] = '-';
    std::__ostream_insert<char,std::char_traits<char>>(os,local_2d,1);
    rhs = (PrettyTime *)-(long)rhs;
  }
  if (rhs < (PrettyTime *)0xe10) {
    poVar1 = std::ostream::_M_insert<long>((long)os);
    local_2d[3] = 0x6d;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2d + 3,1);
    poVar1 = poVar2 + *(long *)(*(long *)poVar2 + -0x18);
    if (poVar2[*(long *)(*(long *)poVar2 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar1);
      poVar1[0xe1] = (ostream)0x1;
    }
    poVar1[0xe0] = (ostream)0x30;
  }
  else {
    poVar1 = std::ostream::_M_insert<long>((long)os);
    local_2d[1] = 0x68;
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2d + 1,1);
    lVar3 = *(long *)poVar2;
    poVar1 = poVar2 + *(long *)(lVar3 + -0x18);
    if (poVar2[*(long *)(lVar3 + -0x18) + 0xe1] == (ostream)0x0) {
      std::ios::widen((char)poVar1);
      poVar1[0xe1] = (ostream)0x1;
      lVar3 = *(long *)poVar2;
    }
    poVar1[0xe0] = (ostream)0x30;
    *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x10) = 2;
    poVar1 = std::ostream::_M_insert<long>((long)poVar2);
    local_2d[2] = 0x6d;
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2d + 2,1);
  }
  *(undefined8 *)(os + *(long *)(*(long *)os + -0x18) + 0x10) = 2;
  poVar1 = std::ostream::_M_insert<long>((long)os);
  local_2d[4] = 0x73;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_2d + 4,1);
  lVar3 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar3 + -0x18) + 0x10) = 0;
  lVar3 = *(long *)(lVar3 + -0x18);
  poVar1 = poVar2 + lVar3;
  if (poVar2[lVar3 + 0xe1] == (ostream)0x0) {
    std::ios::widen((char)poVar1);
    poVar1[0xe1] = (ostream)0x1;
  }
  poVar1[0xe0] = (ostream)0x20;
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const PrettyTime &rhs)
{
    using hours = std::chrono::hours;
    using minutes = std::chrono::minutes;

    seconds t{rhs.mTime};
    if(t.count() < 0)
    {
        os << '-';
        t *= -1;
    }

    // Only handle up to hour formatting
    if(t >= hours{1})
        os << duration_cast<hours>(t).count() << 'h' << std::setfill('0') << std::setw(2)
           << (duration_cast<minutes>(t).count() % 60) << 'm';
    else
        os << duration_cast<minutes>(t).count() << 'm' << std::setfill('0');
    os << std::setw(2) << (duration_cast<seconds>(t).count() % 60) << 's' << std::setw(0)
       << std::setfill(' ');
    return os;
}